

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_attr_parent(lyd_node *root,lyd_attr *attr)

{
  lyd_node *plVar1;
  lyd_attr *plVar2;
  lyd_node *plVar3;
  lyd_node *next;
  
  plVar1 = root;
  if (root == (lyd_node *)0x0) {
    return (lyd_node *)0x0;
  }
  do {
    for (plVar2 = plVar1->attr; plVar2 != (lyd_attr *)0x0; plVar2 = plVar2->next) {
      if (plVar2 == attr) {
        return plVar1;
      }
    }
    if ((plVar1->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar3 = plVar1->child;
    }
    else {
      plVar3 = (lyd_node *)0x0;
    }
    if (plVar3 == (lyd_node *)0x0) {
      if (plVar1 == root) {
        return (lyd_node *)0x0;
      }
      plVar3 = plVar1->next;
    }
    if (plVar3 == (lyd_node *)0x0) {
      do {
        plVar1 = plVar1->parent;
        if (plVar1->parent == root->parent) break;
        plVar3 = plVar1->next;
      } while (plVar3 == (lyd_node *)0x0);
    }
    plVar1 = plVar3;
    if (plVar3 == (lyd_node *)0x0) {
      return (lyd_node *)0x0;
    }
  } while( true );
}

Assistant:

const struct lyd_node *
lyd_attr_parent(const struct lyd_node *root, struct lyd_attr *attr)
{
    const struct lyd_node *next, *elem;
    struct lyd_attr *node_attr;

    LY_TREE_DFS_BEGIN(root, next, elem) {
        for (node_attr = elem->attr; node_attr; node_attr = node_attr->next) {
            if (node_attr == attr) {
                return elem;
            }
        }
        LY_TREE_DFS_END(root, next, elem)
    }

    return NULL;
}